

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void triangle_textured(array<vec<3UL,_int>,_3UL> pts,array<vec<2UL,_double>,_3UL> uvs,
                      vector<double,_std::allocator<double>_> *zbuffer,TGAImage *image,Model *model)

{
  double *pdVar1;
  uint uVar2;
  pointer pdVar3;
  double dVar4;
  vec3i P;
  bool bVar5;
  int iVar6;
  int iVar7;
  TGAColor TVar8;
  size_t sVar9;
  size_t sVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  vec3i A;
  vec3i B;
  TGAColor color;
  vec2f local_98;
  ulong local_80;
  TGAImage *local_78;
  Model *local_70;
  vector<double,_std::allocator<double>_> *local_68;
  vec3i *local_60;
  undefined1 local_58 [16];
  vec3f bc_screen;
  
  local_70 = model;
  local_68 = zbuffer;
  sVar9 = TGAImage::get_width(image);
  local_78 = image;
  sVar10 = TGAImage::get_height(image);
  iVar7 = pts._M_elems[1].z;
  iVar6 = pts._M_elems[0].z;
  uVar18 = 0x80000000;
  uVar11 = 0x7fffffff;
  lVar13 = 0;
  uVar19 = 0x7fffffff;
  uVar17 = 0x80000000;
  do {
    bVar5 = true;
    while( true ) {
      lVar12 = (ulong)bVar5 * 4 + 4;
      uVar15 = uVar17;
      uVar16 = uVar19;
      if (bVar5) {
        uVar15 = uVar18;
        lVar12 = 0;
        uVar16 = uVar11;
      }
      uVar2 = *(uint *)((long)&pts._M_elems[lVar13].x + lVar12);
      iVar14 = (int)sVar10;
      if (bVar5) {
        iVar14 = (int)sVar9;
      }
      if ((int)uVar2 < (int)uVar16) {
        uVar16 = uVar2;
      }
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      if ((int)uVar15 < (int)uVar2) {
        uVar15 = uVar2;
      }
      if ((int)(iVar14 - 1U) <= (int)uVar15) {
        uVar15 = iVar14 - 1U;
      }
      if (!bVar5) break;
      bVar5 = false;
      uVar11 = uVar16;
      uVar18 = uVar15;
    }
    lVar13 = lVar13 + 1;
    uVar19 = uVar16;
    uVar17 = uVar15;
  } while (lVar13 != 3);
  if ((int)uVar11 <= (int)uVar18) {
    local_58._8_4_ = pts._M_elems[0].x;
    local_58._12_4_ = pts._M_elems[0].y;
    local_58._0_4_ = pts._M_elems[1].x;
    local_58._4_4_ = pts._M_elems[1].y;
    local_60 = pts._M_elems + 2;
    local_80 = (ulong)uVar16;
    sVar9 = (size_t)uVar11;
    iVar14 = 0;
    do {
      sVar10 = local_80;
      if ((int)uVar16 <= (int)uVar15) {
        do {
          P.y = (int)sVar10;
          P.x = (int)sVar9;
          P.z = iVar14;
          A.z = iVar6;
          A.x = local_58._8_4_;
          A.y = local_58._12_4_;
          B.z = iVar7;
          B.x = local_58._0_4_;
          B.y = local_58._4_4_;
          barycentric(&bc_screen,A,B,*local_60,P);
          if (((0.0 <= bc_screen.x) && (0.0 <= bc_screen.y)) && (0.0 <= bc_screen.z)) {
            lVar13 = 0;
            iVar14 = 0;
            do {
              lVar12 = (ulong)(lVar13 != 0xc) * 8 + 8;
              if (lVar13 == 0) {
                lVar12 = 0;
              }
              iVar14 = iVar14 + (int)((double)*(int *)((long)&pts._M_elems[0].z + lVar13) *
                                     *(double *)((long)&bc_screen.x + lVar12));
              lVar13 = lVar13 + 0xc;
            } while (lVar13 != 0x24);
            pdVar3 = (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            dVar4 = (double)iVar14;
            pdVar1 = pdVar3 + sVar10 * 600 + sVar9;
            if (*pdVar1 <= dVar4 && dVar4 != *pdVar1) {
              pdVar3[sVar10 * 600 + sVar9] = dVar4;
              local_98.x = 0.0;
              lVar13 = 0;
              local_98.y = 0.0;
              do {
                lVar12 = (ulong)(lVar13 != 0x10) * 8 + 8;
                if (lVar13 == 0) {
                  lVar12 = 0;
                }
                dVar4 = *(double *)((long)&bc_screen.x + lVar12);
                local_98.x = local_98.x + *(double *)((long)&uvs._M_elems[0].x + lVar13) * dVar4;
                local_98.y = local_98.y + dVar4 * *(double *)((long)&uvs._M_elems[0].y + lVar13);
                lVar13 = lVar13 + 0x10;
              } while (lVar13 != 0x30);
              TVar8 = Model::diffuse(local_70,&local_98);
              color.bgra = TVar8.bgra;
              color.bytespp = TVar8.bytespp;
              TGAImage::set(local_78,sVar9,sVar10,&color);
            }
          }
          sVar10 = sVar10 + 1;
        } while (uVar15 + 1 != (int)sVar10);
      }
      sVar9 = sVar9 + 1;
    } while (uVar18 + 1 != (int)sVar9);
  }
  return;
}

Assistant:

void triangle_textured(std::array<vec3i, 3> pts, std::array<vec2f, 3> uvs,
                       std::vector<double> &zbuffer, TGAImage &image, Model &model)
{
    vec2i bboxmin(std::numeric_limits<int>::max(), std::numeric_limits<int>::max());
    vec2i bboxmax(std::numeric_limits<int>::min(), std::numeric_limits<int>::min());
    vec2i clamp(image.get_width() - 1, image.get_height() - 1);
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
            bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
        }
    }
    vec3i P;
    for (P.x = bboxmin.x; P.x <= bboxmax.x; P.x++) {
        for (P.y = bboxmin.y; P.y <= bboxmax.y; P.y++) {
            vec3f bc_screen = barycentric(pts[0], pts[1], pts[2], P);
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0) continue;
            P.z = 0;
            for (int i = 0; i < 3; i++) P.z += static_cast<int>(pts[i][2] * bc_screen[i]);
            if (zbuffer[P.x + P.y * width] < P.z) {
                zbuffer[P.x + P.y * width] = P.z;
                vec2f uv{0, 0};
                for (int i = 0; i < 3; i++) {
                    uv.x += uvs[i].x * bc_screen[i];
                    uv.y += uvs[i].y * bc_screen[i];
                }
                TGAColor color = model.diffuse(uv);

                image.set(P.x, P.y, color);
            }
        }
    }
}